

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O1

void CreateBackwardReferencesNH2
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               BrotliEncoderParams *params,HasherHandle hasher,int *dist_cache,
               size_t *last_insert_len,Command_conflict *commands,size_t *num_commands,
               size_t *num_literals)

{
  ulong uVar1;
  ulong uVar2;
  int *piVar3;
  long lVar4;
  ulong uVar5;
  BrotliDictionary *pBVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  ushort uVar10;
  uint32_t uVar11;
  ulong uVar12;
  int *piVar13;
  ulong uVar14;
  uint8_t uVar15;
  byte bVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  uint8_t *puVar22;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  ushort uVar27;
  undefined4 uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  long lVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  int iVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  bool bVar41;
  ulong local_110;
  int local_104;
  ulong local_f0;
  size_t local_c8;
  Command_conflict *local_b8;
  ulong local_b0;
  ulong local_a8;
  long local_88;
  uint local_68;
  
  local_c8 = *last_insert_len;
  uVar2 = position + num_bytes;
  uVar12 = (position - 7) + num_bytes;
  if (num_bytes < 8) {
    uVar12 = position;
  }
  lVar32 = 0x200;
  if (params->quality < 9) {
    lVar32 = 0x40;
  }
  if (uVar2 <= position + 8) {
    local_b8 = commands;
LAB_0010ebac:
    *last_insert_len = (local_c8 + uVar2) - position;
    *num_commands = *num_commands + ((long)local_b8 - (long)commands >> 4);
    return;
  }
  uVar37 = (1L << ((byte)params->lgwin & 0x3f)) - 0x10;
  local_a8 = lVar32 + position;
  uVar1 = uVar2 - 7;
  lVar4 = position - 1;
  local_b8 = commands;
  uVar14 = position;
LAB_0010dd43:
  uVar19 = uVar2 - uVar14;
  uVar40 = uVar37;
  if (uVar14 < uVar37) {
    uVar40 = uVar14;
  }
  uVar5 = (params->dist).max_distance;
  uVar38 = uVar14 & ringbuffer_mask;
  piVar3 = (int *)(ringbuffer + uVar38);
  uVar25 = (ulong)(*(long *)(ringbuffer + uVar38) * -0x42e1ca5843000000) >> 0x30;
  uVar15 = ringbuffer[uVar38];
  local_110 = (ulong)*dist_cache;
  uVar33 = 0x7e4;
  uVar28 = (undefined4)uVar14;
  local_68 = (uint)ringbuffer_mask;
  if ((uVar14 <= uVar14 - local_110) ||
     (uVar29 = (ulong)((uint)(uVar14 - local_110) & local_68), uVar15 != ringbuffer[uVar29])) {
    local_110 = 0;
    local_f0 = 0;
LAB_0010de14:
    uVar17 = *(uint *)(hasher + uVar25 * 4 + 0x28);
    *(undefined4 *)(hasher + uVar25 * 4 + 0x28) = uVar28;
    uVar35 = (ulong)(local_68 & uVar17);
    local_104 = 0;
    uVar29 = uVar33;
    uVar39 = local_f0;
    local_b0 = local_110;
    if (((uVar15 != ringbuffer[uVar35]) || (uVar14 == uVar17)) ||
       (uVar30 = uVar14 - uVar17, uVar40 < uVar30)) goto LAB_0010e02b;
    if (7 < uVar19) {
      uVar29 = uVar19 & 0xfffffffffffffff8;
      piVar13 = (int *)(ringbuffer + uVar29 + uVar38);
      lVar20 = 0;
      uVar38 = 0;
LAB_0010de97:
      if (*(ulong *)(piVar3 + uVar38 * 2) == *(ulong *)(ringbuffer + uVar38 * 8 + uVar35))
      goto code_r0x0010dea9;
      uVar29 = *(ulong *)(ringbuffer + uVar38 * 8 + uVar35) ^ *(ulong *)(piVar3 + uVar38 * 2);
      uVar38 = 0;
      if (uVar29 != 0) {
        for (; (uVar29 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
        }
      }
      uVar39 = (uVar38 >> 3 & 0x1fffffff) - lVar20;
      goto LAB_0010df02;
    }
    uVar29 = 0;
    piVar13 = piVar3;
LAB_0010eae9:
    uVar38 = uVar19 & 7;
    uVar39 = uVar29;
    if (uVar38 != 0) {
      uVar21 = uVar29 | uVar38;
      do {
        uVar39 = uVar29;
        if (ringbuffer[uVar29 + uVar35] != (uint8_t)*piVar13) break;
        piVar13 = (int *)((long)piVar13 + 1);
        uVar29 = uVar29 + 1;
        uVar38 = uVar38 - 1;
        uVar39 = uVar21;
      } while (uVar38 != 0);
    }
LAB_0010df02:
    if (3 < uVar39) {
      iVar18 = 0x1f;
      if ((uint)uVar30 != 0) {
        for (; (uint)uVar30 >> iVar18 == 0; iVar18 = iVar18 + -1) {
        }
      }
      uVar29 = (ulong)(iVar18 * -0x1e + 0x780) + uVar39 * 0x87;
      local_b0 = uVar30;
      if (uVar33 < uVar29) goto LAB_0010e02b;
    }
    local_104 = 0;
    if ((uVar33 == 0x7e4) && (*(ulong *)(hasher + 0x18) >> 7 <= *(ulong *)(hasher + 0x20))) {
      uVar27 = (params->dictionary).hash_table[(ulong)((uint)(*piVar3 * 0x1e35a7bd) >> 0x12) * 2];
      *(long *)(hasher + 0x18) = *(long *)(hasher + 0x18) + 1;
      if ((ulong)uVar27 == 0) goto LAB_0010df9f;
      uVar17 = uVar27 & 0x1f;
      uVar38 = (ulong)uVar17;
      bVar41 = true;
      local_104 = 0;
      if (uVar38 <= uVar19) {
        pBVar6 = (params->dictionary).words;
        puVar22 = pBVar6->data + (ulong)pBVar6->offsets_by_length[uVar38] + uVar38 * (uVar27 >> 5);
        if (7 < uVar38) {
          uVar39 = (ulong)(uVar27 & 0x18);
          lVar20 = 0;
          uVar29 = 0;
LAB_0010e9c8:
          if (*(ulong *)(puVar22 + uVar29 * 8) == *(ulong *)(piVar3 + uVar29 * 2))
          goto code_r0x0010e9da;
          uVar39 = *(ulong *)(piVar3 + uVar29 * 2) ^ *(ulong *)(puVar22 + uVar29 * 8);
          uVar29 = 0;
          if (uVar39 != 0) {
            for (; (uVar39 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
            }
          }
          uVar29 = (uVar29 >> 3 & 0x1fffffff) - lVar20;
          goto LAB_0010ea1b;
        }
        uVar39 = 0;
        goto LAB_0010eb74;
      }
      goto LAB_0010df85;
    }
    goto LAB_0010df9f;
  }
  if (7 < uVar19) {
    uVar33 = uVar19 & 0xfffffffffffffff8;
    piVar13 = (int *)(ringbuffer + uVar33 + uVar38);
    lVar20 = 0;
    uVar39 = 0;
LAB_0010ddd0:
    if (*(ulong *)(piVar3 + uVar39 * 2) == *(ulong *)(ringbuffer + uVar39 * 8 + uVar29))
    goto code_r0x0010dde1;
    uVar29 = *(ulong *)(ringbuffer + uVar39 * 8 + uVar29) ^ *(ulong *)(piVar3 + uVar39 * 2);
    uVar33 = 0;
    if (uVar29 != 0) {
      for (; (uVar29 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
      }
    }
    local_f0 = (uVar33 >> 3 & 0x1fffffff) - lVar20;
    goto LAB_0010dfc7;
  }
  uVar33 = 0;
  piVar13 = piVar3;
LAB_0010eb24:
  uVar39 = uVar19 & 7;
  local_f0 = uVar33;
  if (uVar39 != 0) {
    uVar35 = uVar33 | uVar39;
    do {
      local_f0 = uVar33;
      if (ringbuffer[uVar33 + uVar29] != (uint8_t)*piVar13) break;
      piVar13 = (int *)((long)piVar13 + 1);
      uVar33 = uVar33 + 1;
      uVar39 = uVar39 - 1;
      local_f0 = uVar35;
    } while (uVar39 != 0);
  }
LAB_0010dfc7:
  uVar33 = 0x7e4;
  if (local_f0 < 4) {
    bVar41 = true;
LAB_0010e008:
    local_110 = 0;
    local_f0 = 0;
  }
  else {
    uVar29 = local_f0 * 0x87 + 0x78f;
    bVar41 = uVar29 < 0x7e5;
    if (bVar41) goto LAB_0010e008;
    uVar15 = *(uint8_t *)((long)piVar3 + local_f0);
    *(undefined4 *)(hasher + uVar25 * 4 + 0x28) = uVar28;
    uVar33 = uVar29;
  }
  local_104 = 0;
  uVar29 = uVar33;
  uVar39 = local_f0;
  local_b0 = local_110;
  if (bVar41) goto LAB_0010de14;
  goto LAB_0010e02b;
code_r0x0010dde1:
  uVar39 = uVar39 + 1;
  lVar20 = lVar20 + -8;
  if (uVar19 >> 3 == uVar39) goto LAB_0010eb24;
  goto LAB_0010ddd0;
code_r0x0010dea9:
  uVar38 = uVar38 + 1;
  lVar20 = lVar20 + -8;
  if (uVar19 >> 3 == uVar38) goto LAB_0010eae9;
  goto LAB_0010de97;
code_r0x0010e9da:
  uVar29 = uVar29 + 1;
  lVar20 = lVar20 + -8;
  if (uVar17 >> 3 == uVar29) goto code_r0x0010e9e6;
  goto LAB_0010e9c8;
code_r0x0010e9e6:
  puVar22 = puVar22 + -lVar20;
LAB_0010eb74:
  uVar35 = (ulong)uVar27 & 7;
  uVar29 = uVar39;
  if ((uVar27 & 7) != 0) {
    uVar30 = uVar39 | uVar35;
    do {
      uVar29 = uVar39;
      if (*(uint8_t *)((long)piVar3 + uVar39) != *puVar22) break;
      puVar22 = puVar22 + 1;
      uVar39 = uVar39 + 1;
      uVar35 = uVar35 - 1;
      uVar29 = uVar30;
    } while (uVar35 != 0);
  }
LAB_0010ea1b:
  if (((uVar29 != 0) && (uVar38 < (params->dictionary).cutoffTransformsCount + uVar29)) &&
     (uVar40 = uVar40 + 1 + (ulong)(uVar27 >> 5) +
               ((ulong)((uint)((params->dictionary).cutoffTransforms >>
                              ((char)(uVar38 - uVar29) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar38 - uVar29) * 4 << (pBVar6->size_bits_by_length[uVar38] & 0x3f)),
     uVar40 <= uVar5)) {
    iVar18 = 0x1f;
    if ((uint)uVar40 != 0) {
      for (; (uint)uVar40 >> iVar18 == 0; iVar18 = iVar18 + -1) {
      }
    }
    uVar38 = (uVar29 * 0x87 - (ulong)(uint)(iVar18 * 0x1e)) + 0x780;
    if (0x7e3 < uVar38) {
      local_104 = uVar17 - (int)uVar29;
      bVar41 = false;
      uVar33 = uVar38;
      local_110 = uVar40;
      local_f0 = uVar29;
    }
  }
LAB_0010df85:
  if (!bVar41) {
    *(long *)(hasher + 0x20) = *(long *)(hasher + 0x20) + 1;
  }
LAB_0010df9f:
  *(undefined4 *)(hasher + uVar25 * 4 + 0x28) = uVar28;
  uVar29 = uVar33;
  uVar39 = local_f0;
  local_b0 = local_110;
LAB_0010e02b:
  if (0x7e4 < uVar29) {
    iVar18 = *dist_cache;
    uVar40 = (lVar4 + num_bytes) - uVar14;
    local_f0 = uVar29;
    iVar9 = 0;
LAB_0010e068:
    uVar19 = uVar19 - 1;
    uVar33 = uVar39 - 1;
    if (uVar19 <= uVar39 - 1) {
      uVar33 = uVar19;
    }
    if (4 < params->quality) {
      uVar33 = 0;
    }
    uVar25 = uVar14 + 1;
    uVar38 = uVar37;
    if (uVar25 < uVar37) {
      uVar38 = uVar25;
    }
    piVar3 = (int *)(ringbuffer + (uVar25 & ringbuffer_mask));
    uVar30 = (ulong)(*(long *)(ringbuffer + (uVar25 & ringbuffer_mask)) * -0x42e1ca5843000000) >>
             0x30;
    uVar15 = *(uint8_t *)(uVar33 + (long)piVar3);
    uVar35 = uVar25 - (long)iVar18;
    uVar29 = 0x7e4;
    uVar28 = (undefined4)uVar25;
    if ((uVar35 < uVar25) &&
       (uVar17 = (uint)uVar35 & local_68, uVar15 == ringbuffer[uVar33 + uVar17])) {
      if (7 < uVar19) {
        lVar20 = 0;
        uVar29 = 0;
LAB_0010e0fb:
        if (*(ulong *)(piVar3 + uVar29 * 2) == *(ulong *)(ringbuffer + uVar29 * 8 + (ulong)uVar17))
        goto code_r0x0010e10c;
        uVar35 = *(ulong *)(ringbuffer + uVar29 * 8 + (ulong)uVar17) ^
                 *(ulong *)(piVar3 + uVar29 * 2);
        uVar29 = 0;
        if (uVar35 != 0) {
          for (; (uVar35 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
          }
        }
        uVar35 = (uVar29 >> 3 & 0x1fffffff) - lVar20;
        goto LAB_0010e26e;
      }
      uVar35 = 0;
      piVar13 = piVar3;
      goto LAB_0010e4f2;
    }
    local_110 = 0;
    uVar35 = uVar33;
    goto LAB_0010e13a;
  }
  local_c8 = local_c8 + 1;
  position = uVar14 + 1;
  if (local_a8 < position) {
    if ((uint)((int)lVar32 * 4) + local_a8 < position) {
      uVar40 = uVar14 + 0x11;
      if (uVar1 <= uVar14 + 0x11) {
        uVar40 = uVar1;
      }
      for (; position < uVar40; position = position + 4) {
        *(int *)(hasher + ((ulong)(*(long *)(ringbuffer + (position & ringbuffer_mask)) *
                                  -0x42e1ca5843000000) >> 0x30) * 4 + 0x28) = (int)position;
        local_c8 = local_c8 + 4;
      }
    }
    else {
      uVar40 = uVar14 + 9;
      if (uVar1 <= uVar14 + 9) {
        uVar40 = uVar1;
      }
      for (; position < uVar40; position = position + 2) {
        *(int *)(hasher + ((ulong)(*(long *)(ringbuffer + (position & ringbuffer_mask)) *
                                  -0x42e1ca5843000000) >> 0x30) * 4 + 0x28) = (int)position;
        local_c8 = local_c8 + 2;
      }
    }
  }
  goto LAB_0010e936;
code_r0x0010e10c:
  uVar29 = uVar29 + 1;
  lVar20 = lVar20 + -8;
  if (uVar40 >> 3 == uVar29) goto code_r0x0010e118;
  goto LAB_0010e0fb;
code_r0x0010e118:
  uVar35 = -lVar20;
  piVar13 = (int *)((long)piVar3 - lVar20);
LAB_0010e4f2:
  uVar29 = uVar19 & 7;
  for (; (uVar29 != 0 && (ringbuffer[uVar35 + uVar17] == (uint8_t)*piVar13)); uVar35 = uVar35 + 1) {
    piVar13 = (int *)((long)piVar13 + 1);
    uVar29 = uVar29 - 1;
  }
LAB_0010e26e:
  uVar29 = 0x7e4;
  if (uVar35 < 4) {
    bVar41 = true;
LAB_0010e2b9:
    local_110 = 0;
    uVar35 = uVar33;
  }
  else {
    uVar21 = uVar35 * 0x87 + 0x78f;
    bVar41 = uVar21 < 0x7e5;
    if (bVar41) goto LAB_0010e2b9;
    uVar15 = *(uint8_t *)((long)piVar3 + uVar35);
    *(undefined4 *)(hasher + uVar30 * 4 + 0x28) = uVar28;
    local_110 = (long)iVar18;
    uVar29 = uVar21;
  }
  iVar36 = 0;
  uVar26 = uVar29;
  uVar21 = uVar35;
  uVar31 = local_110;
  if (!bVar41) goto LAB_0010e2e9;
LAB_0010e13a:
  uVar17 = *(uint *)(hasher + uVar30 * 4 + 0x28);
  *(undefined4 *)(hasher + uVar30 * 4 + 0x28) = uVar28;
  uVar23 = local_68 & uVar17;
  iVar36 = 0;
  uVar26 = uVar29;
  uVar21 = uVar35;
  uVar31 = local_110;
  if (((uVar15 != ringbuffer[uVar33 + uVar23]) || (uVar25 == uVar17)) ||
     (uVar33 = uVar25 - uVar17, uVar38 < uVar33)) goto LAB_0010e2e9;
  if (7 < uVar19) {
    lVar20 = 0;
    uVar21 = 0;
LAB_0010e184:
    if (*(ulong *)(piVar3 + uVar21 * 2) == *(ulong *)(ringbuffer + uVar21 * 8 + (ulong)uVar23))
    goto code_r0x0010e191;
    uVar26 = *(ulong *)(ringbuffer + uVar21 * 8 + (ulong)uVar23) ^ *(ulong *)(piVar3 + uVar21 * 2);
    uVar21 = 0;
    if (uVar26 != 0) {
      for (; (uVar26 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
      }
    }
    uVar21 = (uVar21 >> 3 & 0x1fffffff) - lVar20;
    goto LAB_0010e1c9;
  }
  uVar21 = 0;
  piVar13 = piVar3;
LAB_0010e4c1:
  uVar26 = uVar19 & 7;
  for (; (uVar26 != 0 && (ringbuffer[uVar21 + uVar23] == (uint8_t)*piVar13)); uVar21 = uVar21 + 1) {
    piVar13 = (int *)((long)piVar13 + 1);
    uVar26 = uVar26 - 1;
  }
LAB_0010e1c9:
  if (3 < uVar21) {
    iVar36 = 0x1f;
    if ((uint)uVar33 != 0) {
      for (; (uint)uVar33 >> iVar36 == 0; iVar36 = iVar36 + -1) {
      }
    }
    uVar26 = (ulong)(iVar36 * -0x1e + 0x780) + uVar21 * 0x87;
    uVar31 = uVar33;
    iVar36 = 0;
    if (uVar29 < uVar26) goto LAB_0010e2e9;
  }
  if ((uVar29 == 0x7e4) && (*(ulong *)(hasher + 0x18) >> 7 <= *(ulong *)(hasher + 0x20))) {
    uVar27 = (params->dictionary).hash_table[(ulong)((uint)(*piVar3 * 0x1e35a7bd) >> 0x12) * 2];
    *(long *)(hasher + 0x18) = *(long *)(hasher + 0x18) + 1;
    if ((ulong)uVar27 == 0) goto LAB_0010e2d9;
    uVar17 = uVar27 & 0x1f;
    uVar33 = (ulong)uVar17;
    if (uVar19 < uVar33) {
LAB_0010e24d:
      iVar36 = 0;
      bVar41 = true;
    }
    else {
      iVar36 = 0;
      pBVar6 = (params->dictionary).words;
      puVar22 = pBVar6->data + (ulong)pBVar6->offsets_by_length[uVar33] + uVar33 * (uVar27 >> 5);
      if (7 < uVar33) {
        uVar21 = (ulong)(uVar27 & 0x18);
        local_88 = 0;
        uVar26 = 0;
LAB_0010e3d6:
        if (*(ulong *)(puVar22 + uVar26 * 8) == *(ulong *)(piVar3 + uVar26 * 2))
        goto code_r0x0010e3e3;
        uVar26 = *(ulong *)(piVar3 + uVar26 * 2) ^ *(ulong *)(puVar22 + uVar26 * 8);
        uVar21 = 0;
        if (uVar26 != 0) {
          for (; (uVar26 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
          }
        }
        uVar26 = (uVar21 >> 3 & 0x1fffffff) - local_88;
        goto LAB_0010e41e;
      }
      uVar21 = 0;
LAB_0010e51b:
      uVar31 = (ulong)uVar27 & 7;
      uVar26 = uVar21;
      if ((uVar27 & 7) != 0) {
        uVar34 = uVar21 | uVar31;
        do {
          uVar26 = uVar21;
          if (*(uint8_t *)((long)piVar3 + uVar21) != *puVar22) break;
          puVar22 = puVar22 + 1;
          uVar21 = uVar21 + 1;
          uVar31 = uVar31 - 1;
          uVar26 = uVar34;
        } while (uVar31 != 0);
      }
LAB_0010e41e:
      bVar41 = true;
      if (((uVar26 == 0) || ((params->dictionary).cutoffTransformsCount + uVar26 <= uVar33)) ||
         (uVar33 = uVar38 + 1 + (ulong)(uVar27 >> 5) +
                   ((ulong)((uint)((params->dictionary).cutoffTransforms >>
                                  ((char)(uVar33 - uVar26) * '\x06' & 0x3fU)) & 0x3f) +
                    (uVar33 - uVar26) * 4 << (pBVar6->size_bits_by_length[uVar33] & 0x3f)),
         uVar5 < uVar33)) goto LAB_0010e24d;
      iVar8 = 0x1f;
      if ((uint)uVar33 != 0) {
        for (; (uint)uVar33 >> iVar8 == 0; iVar8 = iVar8 + -1) {
        }
      }
      uVar38 = (uVar26 * 0x87 - (ulong)(uint)(iVar8 * 0x1e)) + 0x780;
      if (0x7e3 < uVar38) {
        iVar36 = uVar17 - (int)uVar26;
        bVar41 = false;
        uVar35 = uVar26;
        local_110 = uVar33;
        uVar29 = uVar38;
      }
    }
    if (!bVar41) {
      *(long *)(hasher + 0x20) = *(long *)(hasher + 0x20) + 1;
    }
  }
  else {
LAB_0010e2d9:
    iVar36 = 0;
  }
  *(undefined4 *)(hasher + uVar30 * 4 + 0x28) = uVar28;
  uVar26 = uVar29;
  uVar21 = uVar35;
  uVar31 = local_110;
LAB_0010e2e9:
  bVar41 = local_f0 + 0xaf <= uVar26;
  local_a8 = uVar14;
  iVar8 = iVar9;
  if (bVar41) {
    local_c8 = local_c8 + 1;
    local_a8 = uVar25;
    uVar39 = uVar21;
    local_104 = iVar36;
    local_f0 = uVar26;
    local_b0 = uVar31;
    iVar8 = iVar9 + 1;
  }
  bVar7 = 2 < iVar9;
  uVar33 = uVar14 + 9;
  uVar40 = uVar40 - 1;
  uVar14 = local_a8;
  iVar9 = iVar8;
  if (!bVar41 || (bVar7 || uVar2 <= uVar33)) goto LAB_0010e5d0;
  goto LAB_0010e068;
code_r0x0010e191:
  uVar21 = uVar21 + 1;
  lVar20 = lVar20 + -8;
  if (uVar40 >> 3 == uVar21) goto code_r0x0010e19d;
  goto LAB_0010e184;
code_r0x0010e19d:
  uVar21 = -lVar20;
  piVar13 = (int *)((long)piVar3 - lVar20);
  goto LAB_0010e4c1;
code_r0x0010e3e3:
  uVar26 = uVar26 + 1;
  local_88 = local_88 + -8;
  if (uVar17 >> 3 == uVar26) goto code_r0x0010e3f3;
  goto LAB_0010e3d6;
code_r0x0010e3f3:
  puVar22 = puVar22 + -local_88;
  goto LAB_0010e51b;
LAB_0010e5d0:
  uVar14 = uVar37;
  if (local_a8 < uVar37) {
    uVar14 = local_a8;
  }
  if (uVar14 < local_b0) {
LAB_0010e69a:
    uVar40 = local_b0 + 0xf;
  }
  else {
    uVar17 = 0;
    bVar41 = false;
    if (local_b0 != (long)*dist_cache) {
      if (local_b0 == (long)dist_cache[1]) {
        uVar17 = 1;
      }
      else {
        uVar40 = (local_b0 + 3) - (long)*dist_cache;
        if (uVar40 < 7) {
          bVar16 = (byte)((int)uVar40 << 2);
          uVar17 = 0x9750468;
        }
        else {
          uVar40 = (local_b0 + 3) - (long)dist_cache[1];
          if (6 < uVar40) {
            if (local_b0 != (long)dist_cache[2]) {
              bVar41 = local_b0 != (long)dist_cache[3];
              uVar17 = 3;
              goto LAB_0010e696;
            }
            uVar17 = 2;
            goto LAB_0010e694;
          }
          bVar16 = (byte)((int)uVar40 << 2);
          uVar17 = 0xfdb1ace;
        }
        uVar17 = uVar17 >> (bVar16 & 0x1f) & 0xf;
      }
LAB_0010e694:
      bVar41 = false;
    }
LAB_0010e696:
    if (bVar41) goto LAB_0010e69a;
    uVar40 = (ulong)uVar17;
  }
  if ((local_b0 <= uVar14) && (uVar40 != 0)) {
    dist_cache[3] = dist_cache[2];
    *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
    *dist_cache = (int)local_b0;
  }
  uVar17 = (uint)local_c8;
  local_b8->insert_len_ = uVar17;
  local_b8->copy_len_ = local_104 << 0x19 | (uint)uVar39;
  uVar19 = (ulong)(params->dist).num_direct_distance_codes;
  uVar14 = uVar19 + 0x10;
  if (uVar40 < uVar14) {
    local_b8->dist_prefix_ = (uint16_t)uVar40;
    uVar11 = 0;
  }
  else {
    uVar11 = (params->dist).distance_postfix_bits;
    bVar16 = (byte)uVar11;
    uVar40 = ((uVar40 - uVar19) + (4L << (bVar16 & 0x3f))) - 0x10;
    uVar23 = 0x1f;
    if ((uint)uVar40 != 0) {
      for (; (uint)uVar40 >> uVar23 == 0; uVar23 = uVar23 - 1) {
      }
    }
    uVar24 = (uVar23 ^ 0xffffffe0) + 0x1f;
    uVar23 = (uint)((uVar40 >> ((ulong)uVar24 & 0x3f) & 1) != 0);
    iVar18 = uVar24 - uVar11;
    local_b8->dist_prefix_ =
         (short)(uVar23 + iVar18 * 2 + 0xfffe << (bVar16 & 0x3f)) +
         (short)uVar14 + (~(ushort)(-1 << (bVar16 & 0x1f)) & (ushort)uVar40) | (short)iVar18 * 0x400
    ;
    uVar11 = (uint32_t)(uVar40 - ((ulong)uVar23 + 2 << ((byte)uVar24 & 0x3f)) >> (bVar16 & 0x3f));
  }
  local_b8->dist_extra_ = uVar11;
  if (5 < local_c8) {
    if (local_c8 < 0x82) {
      uVar17 = 0x1f;
      uVar23 = (uint)(local_c8 - 2);
      if (uVar23 != 0) {
        for (; uVar23 >> uVar17 == 0; uVar17 = uVar17 - 1) {
        }
      }
      uVar17 = (int)(local_c8 - 2 >> ((char)(uVar17 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar17 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (local_c8 < 0x842) {
      uVar23 = 0x1f;
      if (uVar17 - 0x42 != 0) {
        for (; uVar17 - 0x42 >> uVar23 == 0; uVar23 = uVar23 - 1) {
        }
      }
      uVar17 = (uVar23 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar17 = 0x15;
      if (0x1841 < local_c8) {
        uVar17 = (uint)(ushort)(0x17 - (local_c8 < 0x5842));
      }
    }
  }
  uVar23 = local_104 + (uint)uVar39;
  if (uVar23 < 10) {
    uVar24 = uVar23 - 2;
  }
  else if (uVar23 < 0x86) {
    uVar23 = uVar23 - 6;
    uVar24 = 0x1f;
    if (uVar23 != 0) {
      for (; uVar23 >> uVar24 == 0; uVar24 = uVar24 - 1) {
      }
    }
    uVar24 = (int)((ulong)(long)(int)uVar23 >> ((char)(uVar24 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
             (uVar24 ^ 0xffffffe0) * 2 + 0x42;
  }
  else {
    uVar24 = 0x17;
    if (uVar23 < 0x846) {
      uVar24 = 0x1f;
      if (uVar23 - 0x46 != 0) {
        for (; uVar23 - 0x46 >> uVar24 == 0; uVar24 = uVar24 - 1) {
        }
      }
      uVar24 = (uVar24 ^ 0xffe0) + 0x2c;
    }
  }
  uVar10 = (ushort)uVar24;
  uVar27 = (uVar10 & 7) + ((ushort)uVar17 & 7) * 8;
  if ((((local_b8->dist_prefix_ & 0x3ff) == 0) && ((ushort)uVar17 < 8)) && (uVar10 < 0x10)) {
    if (7 < uVar10) {
      uVar27 = uVar27 | 0x40;
    }
  }
  else {
    iVar18 = ((uVar17 & 0xffff) >> 3) * 3 + ((uVar24 & 0xffff) >> 3);
    uVar27 = uVar27 + ((ushort)(0x520d40 >> ((char)iVar18 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar18 * 0x40 + 0x40;
  }
  local_b8->cmd_prefix_ = uVar27;
  *num_literals = *num_literals + local_c8;
  position = uVar39 + local_a8;
  uVar14 = uVar12;
  if (position < uVar12) {
    uVar14 = position;
  }
  uVar40 = local_a8 + 2;
  if (local_b0 < uVar39 >> 2) {
    uVar19 = position + local_b0 * -4;
    if (uVar19 < uVar40) {
      uVar19 = uVar40;
    }
    uVar40 = uVar19;
    if (uVar14 < uVar19) {
      uVar40 = uVar14;
    }
  }
  local_a8 = lVar32 + uVar39 * 2 + local_a8;
  local_b8 = local_b8 + 1;
  if (uVar40 < uVar14) {
    do {
      *(int *)(hasher + ((ulong)(*(long *)(ringbuffer + (uVar40 & ringbuffer_mask)) *
                                -0x42e1ca5843000000) >> 0x30) * 4 + 0x28) = (int)uVar40;
      uVar40 = uVar40 + 1;
    } while (uVar14 != uVar40);
  }
  local_c8 = 0;
LAB_0010e936:
  uVar14 = position;
  if (uVar2 <= position + 8) goto LAB_0010ebac;
  goto LAB_0010dd43;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    const BrotliEncoderParams* params, HasherHandle hasher, int* dist_cache,
    size_t* last_insert_len, Command* commands, size_t* num_commands,
    size_t* num_literals) {
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(hasher, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(hasher, &params->dictionary,
                         ringbuffer, ringbuffer_mask, dist_cache, position,
                         max_length, max_distance, gap,
                         params->dist.max_distance, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        FN(FindLongestMatch)(hasher, &params->dictionary,
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, gap, params->dist.max_distance, &sr2);
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code =
            ComputeDistanceCode(sr.distance, max_distance + gap, dist_cache);
        if ((sr.distance <= (max_distance + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(hasher, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(hasher, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}